

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v6::internal::
     handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<__int128,fmt::v6::basic_format_specs<char>>>
               (char spec,int_writer<__int128,_fmt::v6::basic_format_specs<char>_> *handler)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar1 == 0) {
LAB_0012230d:
    basic_writer<fmt::v6::buffer_range<char>_>::
    int_writer<__int128,_fmt::v6::basic_format_specs<char>_>::on_dec(handler);
    return;
  }
  if (iVar1 != 0x42) {
    if (iVar1 == 0x4c) {
LAB_00122315:
      basic_writer<fmt::v6::buffer_range<char>_>::
      int_writer<__int128,_fmt::v6::basic_format_specs<char>_>::on_num(handler);
      return;
    }
    if (iVar1 != 0x58) {
      if (iVar1 == 0x62) goto LAB_00122325;
      if (iVar1 != 0x78) {
        if (iVar1 != 0x6e) {
          if (iVar1 == 0x6f) {
            basic_writer<fmt::v6::buffer_range<char>_>::
            int_writer<__int128,_fmt::v6::basic_format_specs<char>_>::on_oct(handler);
            return;
          }
          if (iVar1 != 100) {
            basic_writer<fmt::v6::buffer_range<char>_>::
            int_writer<__int128,_fmt::v6::basic_format_specs<char>_>::on_error(handler);
          }
          goto LAB_0012230d;
        }
        goto LAB_00122315;
      }
    }
    basic_writer<fmt::v6::buffer_range<char>_>::
    int_writer<__int128,_fmt::v6::basic_format_specs<char>_>::on_hex(handler);
    return;
  }
LAB_00122325:
  basic_writer<fmt::v6::buffer_range<char>_>::
  int_writer<__int128,_fmt::v6::basic_format_specs<char>_>::on_bin(handler);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
  case 'L':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}